

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

void __thiscall tinyusdz::ascii::AsciiParser::Setup(AsciiParser *this)

{
  AsciiParser *this_local;
  
  RegisterStageMetas(&this->_supported_stage_metas);
  RegisterPrimMetas(&this->_supported_prim_metas);
  RegisterPropMetas(&this->_supported_prop_metas);
  RegisterPrimAttrTypes(&this->_supported_prim_attr_types);
  RegisterPrimTypes(&this->_supported_prim_types);
  RegisterAPISchemas(&this->_supported_api_schemas);
  return;
}

Assistant:

void AsciiParser::Setup() {
  RegisterStageMetas(_supported_stage_metas);
  RegisterPrimMetas(_supported_prim_metas);
  RegisterPropMetas(_supported_prop_metas);
  RegisterPrimAttrTypes(_supported_prim_attr_types);
  RegisterPrimTypes(_supported_prim_types);
  RegisterAPISchemas(_supported_api_schemas);
}